

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

uint32_t __thiscall
ddd::DaTrie<false,_false,_false>::xcheck_
          (DaTrie<false,_false,_false> *this,Edge *edge,
          vector<ddd::Block,_std::allocator<ddd::Block>_> *blocks)

{
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  size_t sVar4;
  byte *pbVar5;
  const_reference pvVar6;
  DaTrie<false,_false,_false> *this_00;
  DaTrie<false,_false,_false> *pDVar7;
  vector<ddd::Block,_std::allocator<ddd::Block>_> *in_RDX;
  Edge *in_RSI;
  DaTrie<false,_false,_false> *in_RDI;
  uint32_t base;
  uint32_t node_pos;
  uint in_stack_ffffffffffffffbc;
  vector<ddd::Block,_std::allocator<ddd::Block>_> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffcc;
  uint8_t label;
  uint uVar8;
  uint32_t local_4;
  
  label = (uint8_t)((uint)in_stack_ffffffffffffffcc >> 0x18);
  sVar4 = Edge::size(in_RSI);
  if (sVar4 == 1) {
    Edge::begin(in_RSI);
    local_4 = xcheck_(in_RDI,label,in_stack_ffffffffffffffc0);
  }
  else if (in_RDI->head_pos_ == 0xffffffff) {
    local_4 = bc_size((DaTrie<false,_false,_false> *)0x15d239);
    pbVar5 = Edge::begin(in_RSI);
    local_4 = local_4 ^ *pbVar5;
  }
  else {
    uVar3 = in_RDI->head_pos_;
    do {
      pvVar6 = std::vector<ddd::Block,_std::allocator<ddd::Block>_>::operator[]
                         (in_RDX,(ulong)(uVar3 >> 8));
      this_00 = (DaTrie<false,_false,_false> *)(ulong)pvVar6->num_emps;
      pDVar7 = (DaTrie<false,_false,_false> *)Edge::size(in_RSI);
      if (pDVar7 <= this_00) {
        uVar8 = uVar3;
        pbVar5 = Edge::begin(in_RSI);
        uVar2 = uVar3 ^ *pbVar5;
        bVar1 = is_target_((DaTrie<false,_false,_false> *)in_RSI,(uint32_t)((ulong)in_RDX >> 0x20),
                           (Edge *)CONCAT44(uVar8,uVar2));
        in_stack_ffffffffffffffbc = uVar3;
        if (bVar1) {
          return uVar2;
        }
      }
      uVar3 = next_(this_00,in_stack_ffffffffffffffbc);
    } while (uVar3 != in_RDI->head_pos_);
    local_4 = bc_size((DaTrie<false,_false,_false> *)0x15d30e);
    pbVar5 = Edge::begin(in_RSI);
    local_4 = local_4 ^ *pbVar5;
  }
  return local_4;
}

Assistant:

uint32_t xcheck_(const Edge& edge, const std::vector<Block>& blocks) const {
    if (edge.size() == 1) {
      return xcheck_(*edge.begin(), blocks);
    }

    if (head_pos_ == NOT_FOUND) {
      return bc_size() ^ *edge.begin();
    }

    auto node_pos = head_pos_;
    do {
      if (blocks[node_pos / BLOCK_SIZE].num_emps < edge.size()) {
        continue;
      }

      auto base = node_pos ^*edge.begin();
      if (is_target_(base, edge)) {
        return base;
      }
    } while ((node_pos = next_(node_pos)) != head_pos_);

    return bc_size() ^ *edge.begin();
  }